

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode exit_zlib(Curl_easy *data,z_stream *z,zlibInitState *zlib_init,CURLcode result)

{
  int iVar1;
  CURLcode local_24;
  CURLcode result_local;
  zlibInitState *zlib_init_local;
  z_stream *z_local;
  Curl_easy *data_local;
  
  if (*zlib_init == ZLIB_GZIP_HEADER) {
    (*Curl_cfree)(z->next_in);
    z->next_in = (Bytef *)0x0;
  }
  local_24 = result;
  if (*zlib_init != ZLIB_UNINIT) {
    iVar1 = cm_zlib_inflateEnd(z);
    if ((iVar1 != 0) && (result == CURLE_OK)) {
      local_24 = process_zlib_error(data,z);
    }
    *zlib_init = ZLIB_UNINIT;
  }
  return local_24;
}

Assistant:

static CURLcode
exit_zlib(struct Curl_easy *data,
          z_stream *z, zlibInitState *zlib_init, CURLcode result)
{
  if(*zlib_init == ZLIB_GZIP_HEADER)
    Curl_safefree(z->next_in);

  if(*zlib_init != ZLIB_UNINIT) {
    if(inflateEnd(z) != Z_OK && result == CURLE_OK)
      result = process_zlib_error(data, z);
    *zlib_init = ZLIB_UNINIT;
  }

  return result;
}